

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O0

int wally_asset_surjectionproof_size(size_t num_inputs,size_t *written)

{
  size_t local_30;
  size_t num_used;
  size_t *written_local;
  size_t num_inputs_local;
  
  local_30 = num_inputs;
  if (3 < num_inputs) {
    local_30 = 3;
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((num_inputs == 0) || (written == (size_t *)0x0)) {
    num_inputs_local._4_4_ = -2;
  }
  else {
    *written = (num_inputs + 7 >> 3) + 2 + (local_30 + 1) * 0x20;
    num_inputs_local._4_4_ = 0;
  }
  return num_inputs_local._4_4_;
}

Assistant:

int wally_asset_surjectionproof_size(size_t num_inputs, size_t *written)
{
    size_t num_used = num_inputs > 3 ? 3 : num_inputs;
    if (written)
        *written = 0;
    if (!num_inputs || !written)
        return WALLY_EINVAL;
    *written = SECP256K1_SURJECTIONPROOF_SERIALIZATION_BYTES(num_inputs, num_used);
    return WALLY_OK;
}